

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_xor
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  long lVar1;
  string shaderSource_00;
  string shaderSource_01;
  bool bVar2;
  char *__s;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  string shaderSource;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff3c;
  DataType in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff44 [12];
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  _Var7._M_p = (pointer)&local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff50,"atomicXor","")
  ;
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_a0) {
    operator_delete(_Var7._M_p,local_a0._M_allocated_capacity + 1);
  }
  lVar5 = 0;
  do {
    shaderType = *(ShaderType *)((long)&(anonymous_namespace)::s_shaders + lVar5);
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,__s,(allocator<char> *)&stack0xffffffffffffff4f);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x99df33);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar4) {
        local_a0._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_a0._8_8_ = plVar3[3];
        _Var7._M_p = (pointer)&local_a0;
      }
      else {
        local_a0._M_allocated_capacity = paVar4->_M_allocated_capacity;
        _Var7._M_p = (pointer)*plVar3;
      }
      lVar1 = plVar3[1];
      *plVar3 = (long)paVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_a0) {
        operator_delete(_Var7._M_p,local_a0._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar6 = 0x5e;
      (anonymous_namespace)::genShaderSourceAtomicOperations_abi_cxx11_
                ((string *)&stack0xffffffffffffff50,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x15,
                 SHADER_FUNCTION_INTERPOLATED_AT_CENTROID|SHADER_FUNCTION_IMUL_EXTENDED,TYPE_INT,
                 TYPE_LAST,in_stack_ffffffffffffff40);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)local_70,_Var7._M_p,_Var7._M_p + lVar1);
      shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff3c;
      shaderSource_00._M_dataplus._M_p._0_4_ = uVar6;
      shaderSource_00._M_string_length._0_4_ = in_stack_ffffffffffffff40;
      shaderSource_00._12_12_ = in_stack_ffffffffffffff44;
      shaderSource_00.field_2._8_8_ = _Var7._M_p;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_70[0],shaderSource_00);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_a0) {
        operator_delete(_Var7._M_p,local_a0._M_allocated_capacity + 1);
      }
      uVar6 = 0x5e;
      (anonymous_namespace)::genShaderSourceAtomicOperations_abi_cxx11_
                ((string *)&stack0xffffffffffffff50,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x15,SHADER_FUNCTION_LAST,TYPE_UINT,
                 TYPE_LAST,in_stack_ffffffffffffff40);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>((string *)local_90,_Var7._M_p,_Var7._M_p + lVar1);
      shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff3c;
      shaderSource_01._M_dataplus._M_p._0_4_ = uVar6;
      shaderSource_01._M_string_length._0_4_ = in_stack_ffffffffffffff40;
      shaderSource_01._12_12_ = in_stack_ffffffffffffff44;
      shaderSource_01.field_2._8_8_ = _Var7._M_p;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_90[0],shaderSource_01);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_a0) {
        operator_delete(_Var7._M_p,local_a0._M_allocated_capacity + 1);
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_xor (NegativeTestContext& ctx)
{
	ctx.beginSection("atomicXor");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceAtomicOperations(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_ATOMIC_XOR, glu::TYPE_UINT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceAtomicOperations(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_ATOMIC_XOR, glu::TYPE_INT, glu::TYPE_UINT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}